

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O2

bool __thiscall
helics::waitForInit(helics *this,Federate *fed,string_view fedName,milliseconds timeout)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  string_view target;
  string_view target_00;
  string_view queryStr;
  string_view queryStr_00;
  milliseconds delta;
  string res;
  string local_50;
  
  target._M_str = (char *)fedName._M_len;
  target._M_len = (size_t)fed;
  queryStr._M_str = "isinit";
  queryStr._M_len = 6;
  Federate::query_abi_cxx11_(&res,(Federate *)this,target,queryStr,HELICS_SEQUENCING_MODE_ORDERED);
  delta.__r = 400;
  lVar3 = 0;
  do {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &res,"true");
    if (bVar1) break;
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,"error",0
                );
    if (sVar2 != 0xffffffffffffffff) break;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&delta);
    target_00._M_str = (char *)fedName._M_len;
    target_00._M_len = (size_t)fed;
    queryStr_00._M_str = "isinit";
    queryStr_00._M_len = 6;
    Federate::query_abi_cxx11_
              (&local_50,(Federate *)this,target_00,queryStr_00,HELICS_SEQUENCING_MODE_ORDERED);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + delta.__r;
  } while (lVar3 < (long)fedName._M_str);
  std::__cxx11::string::~string((string *)&res);
  return bVar1;
}

Assistant:

bool waitForInit(helics::Federate* fed, std::string_view fedName, std::chrono::milliseconds timeout)
{
    auto res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
    std::chrono::milliseconds waitTime{0};
    const std::chrono::milliseconds delta{400};
    while (res != "true") {
        if (res.find("error") != std::string::npos) {
            return false;
        }
        std::this_thread::sleep_for(delta);
        res = fed->query(fedName, "isinit", HELICS_SEQUENCING_MODE_ORDERED);
        waitTime += delta;
        if (waitTime >= timeout) {
            return false;
        }
    }
    return true;
}